

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtarjan.c
# Opt level: O2

RDL_BCCGraph * RDL_tarjanBCC(RDL_graph *graph)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  void *__ptr;
  ulong uVar8;
  RDL_stack *stack;
  RDL_stack *stack_00;
  undefined4 *element;
  void *__ptr_00;
  uint *puVar9;
  RDL_BCCGraph *pRVar10;
  RDL_graph **ppRVar11;
  uint **ppuVar12;
  uint **ppuVar13;
  uint **ppuVar14;
  uint *puVar15;
  uint **ppuVar16;
  uint *puVar17;
  uint *puVar18;
  RDL_graph *pRVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  size_t sVar27;
  ulong uVar28;
  int iVar29;
  bool bVar30;
  ulong local_78;
  uint ii [2];
  
  sVar27 = (ulong)graph->V << 2;
  pvVar6 = malloc(sVar27);
  pvVar7 = malloc(sVar27);
  uVar20 = graph->E;
  __ptr = malloc((ulong)uVar20 * 4);
  for (uVar8 = 0; uVar20 != uVar8; uVar8 = uVar8 + 1) {
    *(undefined4 *)((long)__ptr + uVar8 * 4) = 0;
  }
  stack = RDL_stack_new();
  uVar8 = (ulong)graph->V;
  for (uVar23 = 0; uVar8 != uVar23; uVar23 = uVar23 + 1) {
    *(undefined4 *)((long)pvVar6 + uVar23 * 4) = 0;
    *(undefined4 *)((long)pvVar7 + uVar23 * 4) = 0;
  }
  uVar20 = 0;
  iVar29 = 1;
  for (uVar23 = 0; uVar23 < uVar8; uVar23 = uVar23 + 1) {
    if (*(int *)((long)pvVar6 + uVar23 * 4) == 0) {
      stack_00 = RDL_stack_new();
      element = (undefined4 *)malloc((ulong)graph->V << 4);
      *element = (int)uVar23;
      *(undefined8 *)(element + 1) = 0xffffffff;
      element[3] = 0xffffffff;
      uVar20 = uVar20 + 1;
      *(uint *)((long)pvVar6 + uVar23 * 4) = uVar20;
      *(uint *)((long)pvVar7 + uVar23 * 4) = uVar20;
      RDL_stack_push(stack_00,element);
      __ptr_00 = malloc((ulong)graph->E << 2);
      local_78 = 0;
      uVar22 = 1;
      while (iVar4 = RDL_stack_empty(stack_00), iVar4 == 0) {
        puVar9 = (uint *)RDL_stack_top(stack_00);
        uVar2 = *puVar9;
        uVar8 = (ulong)uVar2;
        if (puVar9[2] < graph->degree[uVar8]) {
          uVar21 = puVar9[1];
          uVar3 = graph->adjList[uVar8][puVar9[2]][0];
          uVar24 = (ulong)uVar3;
          uVar5 = RDL_edgeId(graph,uVar2,uVar3);
          uVar25 = *(uint *)((long)pvVar6 + uVar24 * 4);
          if (uVar25 == 0) {
            *(uint *)((long)__ptr_00 + local_78 * 4) = uVar5;
            RDL_stack_push(stack,(void *)((long)__ptr_00 + local_78 * 4));
            local_78 = (ulong)((int)local_78 + 1);
            uVar20 = uVar20 + 1;
            *(uint *)((long)pvVar6 + uVar24 * 4) = uVar20;
            *(uint *)((long)pvVar7 + uVar24 * 4) = uVar20;
            uVar8 = (ulong)uVar22;
            uVar22 = uVar22 + 1;
            element[uVar8 * 4] = uVar3;
            element[uVar8 * 4 + 1] = uVar2;
            *(undefined8 *)(element + uVar8 * 4 + 2) = 0xffffffff00000000;
            RDL_stack_push(stack_00,element + uVar8 * 4);
            puVar9[3] = uVar20;
          }
          else {
            puVar9[2] = puVar9[2] + 1;
            if (uVar25 == puVar9[3]) {
              uVar2 = *(uint *)((long)pvVar7 + uVar8 * 4);
              uVar21 = *(uint *)((long)pvVar7 + uVar24 * 4);
              if (uVar2 < uVar21) {
                uVar21 = uVar2;
              }
              *(uint *)((long)pvVar7 + uVar8 * 4) = uVar21;
              if (*(uint *)((long)pvVar6 + uVar8 * 4) <= *(uint *)((long)pvVar7 + uVar24 * 4)) {
                do {
                  puVar9 = (uint *)RDL_stack_top(stack);
                  uVar2 = *puVar9;
                  RDL_stack_pop(stack);
                  *(int *)((long)__ptr + (ulong)uVar2 * 4) = iVar29;
                } while (uVar2 != uVar5);
                iVar29 = iVar29 + 1;
              }
            }
            else if ((uVar25 < *(uint *)((long)pvVar6 + uVar8 * 4)) && (uVar3 != uVar21)) {
              *(uint *)((long)__ptr_00 + local_78 * 4) = uVar5;
              RDL_stack_push(stack,(void *)((long)__ptr_00 + local_78 * 4));
              local_78 = (ulong)((int)local_78 + 1);
              uVar2 = *(uint *)((long)pvVar7 + uVar8 * 4);
              if (uVar2 < uVar25) {
                uVar25 = uVar2;
              }
              *(uint *)((long)pvVar7 + uVar8 * 4) = uVar25;
            }
          }
        }
        else {
          RDL_stack_pop(stack_00);
        }
      }
      free(__ptr_00);
      free(element);
      RDL_stack_delete(stack_00);
      uVar8 = (ulong)graph->V;
    }
  }
  free(pvVar6);
  free(pvVar7);
  RDL_stack_delete(stack);
  uVar23 = (ulong)(iVar29 - 1);
  pRVar10 = (RDL_BCCGraph *)malloc(0x50);
  pvVar6 = malloc(uVar23 * 4);
  pvVar7 = malloc(uVar23 * 4);
  for (uVar8 = 0; uVar23 != uVar8; uVar8 = uVar8 + 1) {
    *(undefined4 *)((long)pvVar6 + uVar8 * 4) = 0;
  }
  uVar8 = (ulong)graph->E;
  for (uVar24 = 0; uVar8 != uVar24; uVar24 = uVar24 + 1) {
    iVar29 = *(int *)((long)__ptr + uVar24 * 4);
    if (iVar29 == 0) {
      (*RDL_outputFunc)(RDL_ERROR,"edge has no associated BCC %u\n");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLtarjan.c"
                    ,0xdd,"RDL_BCCGraph *RDL_tarjanBCC(const RDL_graph *)");
    }
    piVar1 = (int *)((long)pvVar6 + (ulong)(iVar29 - 1) * 4);
    *piVar1 = *piVar1 + 1;
  }
  uVar28 = 0;
  for (uVar24 = 0; uVar20 = (uint)uVar28, uVar23 != uVar24; uVar24 = uVar24 + 1) {
    bVar30 = *(uint *)((long)pvVar6 + uVar24 * 4) < 2;
    uVar22 = 0xfffffffd;
    if (!bVar30) {
      uVar22 = uVar20;
    }
    uVar28 = (ulong)((uVar20 + 1) - (uint)bVar30);
    *(uint *)((long)pvVar7 + uVar24 * 4) = uVar22;
  }
  pRVar10->complete_graph = graph;
  sVar27 = uVar28 * 8;
  ppRVar11 = (RDL_graph **)malloc(sVar27);
  pRVar10->bcc_graphs = ppRVar11;
  ppuVar12 = (uint **)malloc(uVar8 * 8);
  pRVar10->edge_to_bcc_mapping = ppuVar12;
  for (uVar23 = 0; uVar8 != uVar23; uVar23 = uVar23 + 1) {
    puVar9 = (uint *)malloc(8);
    ppuVar12[uVar23] = puVar9;
    *puVar9 = 0xfffffffd;
    puVar9[1] = 0xfffffffd;
  }
  ppuVar13 = (uint **)malloc(sVar27);
  pRVar10->edge_from_bcc_mapping = ppuVar13;
  puVar9 = (uint *)malloc(uVar28 * 4);
  pRVar10->nof_edges_per_bcc = puVar9;
  for (uVar23 = 0; uVar28 != uVar23; uVar23 = uVar23 + 1) {
    ppuVar13[uVar23] = (uint *)0x0;
    puVar9[uVar23] = 0;
  }
  uVar24 = (ulong)graph->V;
  ppuVar14 = (uint **)malloc(uVar24 * 8);
  pRVar10->node_to_bcc_mapping = ppuVar14;
  puVar15 = (uint *)malloc(uVar24 * 4);
  pRVar10->nof_bcc_per_node = puVar15;
  for (uVar23 = 0; uVar24 != uVar23; uVar23 = uVar23 + 1) {
    puVar15[uVar23] = 0;
    ppuVar14[uVar23] = (uint *)0x0;
  }
  ppuVar16 = (uint **)malloc(sVar27);
  pRVar10->node_from_bcc_mapping = ppuVar16;
  puVar17 = (uint *)malloc(uVar28 * 4);
  pRVar10->nof_nodes_per_bcc = puVar17;
  for (uVar23 = 0; uVar28 != uVar23; uVar23 = uVar23 + 1) {
    ppuVar16[uVar23] = (uint *)0x0;
    puVar17[uVar23] = 0;
  }
  pRVar10->nof_bcc = uVar20;
  for (uVar23 = 0; uVar23 < uVar8; uVar23 = uVar23 + 1) {
    uVar24 = (ulong)(*(int *)((long)__ptr + uVar23 * 4) - 1);
    if (1 < *(uint *)((long)pvVar6 + uVar24 * 4)) {
      uVar20 = *(uint *)((long)pvVar7 + uVar24 * 4);
      puVar18 = ppuVar12[uVar23];
      *puVar18 = uVar20;
      uVar22 = puVar9[uVar20];
      puVar9[uVar20] = uVar22 + 1;
      puVar18[1] = uVar22;
      puVar18 = (uint *)realloc(ppuVar13[uVar20],(ulong)puVar9[uVar20] << 2);
      ppuVar13[uVar20] = puVar18;
      puVar18[puVar9[uVar20] - 1] = (uint)uVar23;
      for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
        uVar22 = graph->edges[uVar23][lVar26];
        uVar2 = puVar15[uVar22];
        uVar21 = 0;
        uVar8 = 0;
        bVar30 = false;
        while ((uVar8 < uVar2 && (!bVar30))) {
          uVar24 = (ulong)uVar21;
          uVar8 = uVar8 + 1;
          uVar21 = uVar21 + 2;
          bVar30 = ppuVar14[uVar22][uVar24] == uVar20;
        }
        if (!bVar30) {
          puVar15[uVar22] = uVar2 + 1;
          puVar18 = (uint *)realloc(ppuVar14[uVar22],(ulong)(uVar2 * 2 + 2) << 3);
          ppuVar14[uVar22] = puVar18;
          uVar21 = puVar15[uVar22];
          puVar18[uVar21 * 2 - 2] = uVar20;
          uVar3 = puVar17[uVar20];
          uVar2 = uVar3 + 1;
          puVar17[uVar20] = uVar2;
          puVar18[uVar21 * 2 - 1] = uVar3;
          puVar18 = (uint *)realloc(ppuVar16[uVar20],(ulong)uVar2 << 2);
          ppuVar16[uVar20] = puVar18;
          puVar18[puVar17[uVar20] - 1] = uVar22;
        }
      }
      uVar8 = (ulong)graph->E;
    }
  }
  for (uVar8 = 0; uVar28 != uVar8; uVar8 = uVar8 + 1) {
    pRVar19 = RDL_initNewGraph(puVar17[uVar8]);
    ppRVar11[uVar8] = pRVar19;
  }
  uVar8 = 0;
  do {
    if (graph->E <= uVar8) {
      free(__ptr);
      free(pvVar6);
      free(pvVar7);
      return pRVar10;
    }
    uVar20 = *ppuVar12[uVar8];
    if (uVar20 != 0xfffffffd) {
      ii[1] = 0xfffffffd;
      ii[0] = 0xfffffffd;
      puVar9 = graph->edges[uVar8];
      lVar26 = 0;
      while (lVar26 != 2) {
        uVar22 = puVar9[lVar26];
        uVar2 = puVar15[uVar22];
        for (uVar23 = 0; (ulong)uVar2 * 2 != uVar23; uVar23 = uVar23 + 2) {
          if (ppuVar14[uVar22][uVar23 & 0xffffffff] == uVar20) {
            ii[lVar26] = ppuVar14[uVar22][(int)uVar23 + 1];
          }
        }
        puVar17 = ii + lVar26;
        lVar26 = lVar26 + 1;
        if (*puVar17 == 0xfffffffd) {
          (*RDL_outputFunc)(RDL_ERROR,"node %u not part of BCC %u!\n");
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLtarjan.c"
                        ,0x14f,"RDL_BCCGraph *RDL_tarjanBCC(const RDL_graph *)");
        }
      }
      RDL_addUEdge(ppRVar11[uVar20],ii[0],ii[1]);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

RDL_BCCGraph* RDL_tarjanBCC(const RDL_graph* graph)
{
  unsigned *bcc, u, node, i, j, k, ii[2],
    nof_bcc, *bcc_size, nof_nontrivial_bcc=0, curr_bcc, found;
  unsigned *non_trivial_mapping;
  RDL_BCCGraph* result;

  nof_bcc = RDL_tarjan(graph, &bcc);

  result = malloc(sizeof(*result));
  bcc_size = malloc(nof_bcc * sizeof(*bcc_size));
  non_trivial_mapping = malloc(nof_bcc * sizeof(*non_trivial_mapping));

  for (i = 0; i < nof_bcc; ++i) {
    bcc_size[i] = 0;
  }

  for (i = 0; i < graph->E; ++i) {
    if (bcc[i] == 0) {
      RDL_outputFunc(RDL_ERROR, "edge has no associated BCC %u\n", i);
      assert(0); /* should NEVER happen */
    }
    curr_bcc = bcc[i];
    ++bcc_size[curr_bcc - 1];
  }

  for (i = 0; i < nof_bcc; ++i) {
    if(bcc_size[i] > 1) {
      non_trivial_mapping[i] = nof_nontrivial_bcc;
      ++nof_nontrivial_bcc;
    }
    else {
      non_trivial_mapping[i] = RDL_NO_RINGSYSTEM;
    }
  }

  result->complete_graph = graph;

  result->bcc_graphs = malloc(nof_nontrivial_bcc * sizeof(*result->bcc_graphs));
  result->edge_to_bcc_mapping = malloc(graph->E * sizeof(*result->edge_to_bcc_mapping));

  for (i = 0; i < graph->E; ++i) {
    result->edge_to_bcc_mapping[i] = malloc(2 * sizeof(**result->edge_to_bcc_mapping));
    result->edge_to_bcc_mapping[i][0] = RDL_NO_RINGSYSTEM;
    result->edge_to_bcc_mapping[i][1] = RDL_NO_RINGSYSTEM;
  }

  result->edge_from_bcc_mapping = malloc(nof_nontrivial_bcc * sizeof(*result->edge_from_bcc_mapping));
  result->nof_edges_per_bcc = malloc(nof_nontrivial_bcc * sizeof(*result->nof_edges_per_bcc));
  for (i = 0; i < nof_nontrivial_bcc; ++i) {
    result->edge_from_bcc_mapping[i] = NULL;
    result->nof_edges_per_bcc[i] = 0;
  }

  result->node_to_bcc_mapping = malloc(graph->V * sizeof(*result->node_to_bcc_mapping));
  result->nof_bcc_per_node = malloc(graph->V * sizeof(*result->nof_bcc_per_node));
  for (i = 0; i < graph->V; ++i) {
    result->nof_bcc_per_node[i] = 0;
    result->node_to_bcc_mapping[i] = NULL;
  }

  result->node_from_bcc_mapping = malloc(nof_nontrivial_bcc * sizeof(*result->node_from_bcc_mapping));
  result->nof_nodes_per_bcc = malloc(nof_nontrivial_bcc * sizeof(*result->nof_nodes_per_bcc));
  for (i = 0; i < nof_nontrivial_bcc; ++i) {
    result->node_from_bcc_mapping[i] = NULL;
    result->nof_nodes_per_bcc[i] = 0;
  }

  result->nof_bcc = nof_nontrivial_bcc;

  for (i = 0; i < graph->E; ++i) {
    curr_bcc = bcc[i];

    /* skip trivial BCCs */
    if (bcc_size[curr_bcc-1] <= 1) {
      continue;
    }

    /* -1 because of 1-based BCCs */
    u = non_trivial_mapping[curr_bcc - 1];
    result->edge_to_bcc_mapping[i][0] = u;
    result->edge_to_bcc_mapping[i][1] = result->nof_edges_per_bcc[u]++;
    result->edge_from_bcc_mapping[u] = realloc(result->edge_from_bcc_mapping[u],
        result->nof_edges_per_bcc[u] * sizeof(**result->edge_from_bcc_mapping));
    result->edge_from_bcc_mapping[u][result->nof_edges_per_bcc[u] - 1] = i;

    for (k = 0; k <= 1; ++k) {
      node = graph->edges[i][k];

      found = 0;
      for (j = 0; j < result->nof_bcc_per_node[node] && !found; ++j) {
        if (result->node_to_bcc_mapping[node][2 * j] == u) {
          found = 1;
        }
      }

      if (!found) {
        ++result->nof_bcc_per_node[node];
        result->node_to_bcc_mapping[node] = realloc(result->node_to_bcc_mapping[node],
            2*result->nof_bcc_per_node[node]*sizeof(result->node_to_bcc_mapping[node]));
        result->node_to_bcc_mapping[node][2*(result->nof_bcc_per_node[node] - 1)] = u;
        result->node_to_bcc_mapping[node][2*(result->nof_bcc_per_node[node] - 1)+1] = result->nof_nodes_per_bcc[u]++;

        result->node_from_bcc_mapping[u] = realloc(result->node_from_bcc_mapping[u],
            result->nof_nodes_per_bcc[u] * sizeof(**result->node_from_bcc_mapping));
        result->node_from_bcc_mapping[u][result->nof_nodes_per_bcc[u]-1] = node;
      }
    }
  }

  for (u = 0; u < nof_nontrivial_bcc; ++u) {
    result->bcc_graphs[u] = RDL_initNewGraph(result->nof_nodes_per_bcc[u]);
  }

  for (i = 0; i < graph->E; ++i) {
    u = result->edge_to_bcc_mapping[i][0];

    /* skip if there is no BCC */
    if (u == RDL_NO_RINGSYSTEM) {
      continue;
    }

    ii[0] = ii[1] = RDL_NO_RINGSYSTEM;

    for (k = 0; k <= 1; ++ k) {
      for (j = 0; j < result->nof_bcc_per_node[graph->edges[i][k]]; ++j) {
        if (result->node_to_bcc_mapping[graph->edges[i][k]][2 * j] == u) {
          ii[k] = result->node_to_bcc_mapping[graph->edges[i][k]][2 * j + 1];
        }
      }
      if (ii[k] == RDL_NO_RINGSYSTEM) {
        RDL_outputFunc(RDL_ERROR, "node %u not part of BCC %u!\n",
            graph->edges[i][k], u);
        /* should never happen */
        assert(0);
      }
    }
    RDL_addUEdge(result->bcc_graphs[u], ii[0], ii[1]);
  }

  free(bcc);
  free(bcc_size);
  free(non_trivial_mapping);

  return result;
}